

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall stackjit::ExecutionEngine::~ExecutionEngine(ExecutionEngine *this)

{
  undefined8 uVar1;
  bool bVar2;
  reference ppVar3;
  undefined1 local_50 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
  func;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>_>_>
  *__range1;
  ExecutionEngine *this_local;
  
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>_>_>
           ::begin(&this->mLoadedFunctions);
  func.second = (ManagedFunction *)
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>_>_>
                ::end(&this->mLoadedFunctions);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>,_true>
                         *)&func.second);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>,_false,_true>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
            *)local_50,ppVar3);
    uVar1 = func._24_8_;
    if (func._24_8_ != 0) {
      ManagedFunction::~ManagedFunction((ManagedFunction *)func._24_8_);
      operator_delete((void *)uVar1);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
             *)local_50);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>,_false,_true>
    ::operator++(&__end1);
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>_>_>
  ::~unordered_map(&this->mLoadedFunctions);
  ImageContainer::~ImageContainer(&this->mImageContainer);
  std::__cxx11::string::~string((string *)&this->mBaseDir);
  CallStack::~CallStack(&this->mCallStack);
  JITCompiler::~JITCompiler(&this->mJIT);
  return;
}

Assistant:

ExecutionEngine::~ExecutionEngine() {
		for (auto func : mLoadedFunctions) {
			delete func.second;
		}
	}